

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool Buffer_resize(Buffer *buffer,size_t newSize)

{
  int iVar1;
  deUint8 *__dest;
  size_t numBytes;
  
  if (buffer->capacity < newSize) {
    iVar1 = (int)buffer->capacity * 2;
    if (iVar1 <= (int)newSize) {
      iVar1 = (int)newSize;
    }
    numBytes = (size_t)(int)(iVar1 + 0x1ffU & 0xfffffe00);
    __dest = (deUint8 *)deMalloc(numBytes);
    if (__dest == (deUint8 *)0x0) {
      return 0;
    }
    memcpy(__dest,buffer->data,buffer->size);
    deFree(buffer->data);
    buffer->data = __dest;
    buffer->capacity = numBytes;
  }
  buffer->size = newSize;
  return 1;
}

Assistant:

deBool Buffer_resize (Buffer* buffer, size_t newSize)
{
	/* Grow buffer if necessary. */
	if (newSize > buffer->capacity)
	{
		size_t		newCapacity	= (size_t)deAlign32(deMax32(2*(int)buffer->capacity, (int)newSize), 512);
		deUint8*	newData		= (deUint8*)deMalloc(newCapacity);
		if (!newData)
			return DE_FALSE;

		memcpy(newData, buffer->data, buffer->size);
		deFree(buffer->data);
		buffer->data		= newData;
		buffer->capacity	= newCapacity;
	}

	buffer->size = newSize;
	return DE_TRUE;
}